

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int cd_named_type_init(parser_info *info,char **attr)

{
  int iVar1;
  char *pcVar2;
  char *id;
  coda_type *type;
  char **attr_local;
  parser_info *info_local;
  
  type = (coda_type *)attr;
  attr_local = (char **)info;
  pcVar2 = get_mandatory_attribute_value(attr,"id",info->node->tag);
  if (pcVar2 == (char *)0x0) {
    info_local._4_4_ = -1;
  }
  else {
    *(code **)(*attr_local + 0x38) = coda_type_release;
    if (attr_local[6] == (char *)0x0) {
      __assert_fail("info->product_class != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                    ,0x766,"int cd_named_type_init(parser_info *, const char **)");
    }
    iVar1 = get_named_type((parser_info *)attr_local,pcVar2,(coda_type **)&id);
    if (iVar1 == 0) {
      *(undefined4 *)(*attr_local + 0x40) = *(undefined4 *)id;
      pcVar2 = *attr_local;
      pcVar2[0x44] = '\x01';
      pcVar2[0x45] = '\0';
      pcVar2[0x46] = '\0';
      pcVar2[0x47] = '\0';
      *(char **)(*attr_local + 8) = id;
      info_local._4_4_ = 0;
    }
    else {
      info_local._4_4_ = -1;
    }
  }
  return info_local._4_4_;
}

Assistant:

static int cd_named_type_init(parser_info *info, const char **attr)
{
    coda_type *type;
    const char *id;

    id = get_mandatory_attribute_value(attr, "id", info->node->tag);
    if (id == NULL)
    {
        return -1;
    }
    info->node->free_data = (free_data_handler)coda_type_release;
    assert(info->product_class != NULL);
    if (get_named_type(info, id, &type) != 0)
    {
        return -1;
    }
    info->node->format = type->format;
    info->node->format_set = 1;
    info->node->data = type;

    return 0;
}